

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findIntersectionsInDescendants
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,Node **value,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  bool bVar1;
  iterator pvVar2;
  pointer node_00;
  value_type *child;
  iterator __end0_1;
  iterator __begin0_1;
  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
  *__range3;
  Box<float> local_58;
  reference local_48;
  Node **other;
  iterator __end0;
  iterator __begin0;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
  *intersections_local;
  Node **value_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  __end0 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&node->values);
  other = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&node->values);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&other), bVar1) {
    local_48 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
               ::operator*(&__end0);
    local_58 = anon_class_1_0_00000001_for_mGetBox::operator()
                         ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*value);
    ___range3 = anon_class_1_0_00000001_for_mGetBox::operator()
                          ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*local_48);
    bVar1 = Box<float>::intersects(&local_58,(Box<float> *)&__range3);
    if (bVar1) {
      std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
      emplace_back<Node*const&,Node*const&>
                ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
                 intersections,value,local_48);
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end0);
  }
  bVar1 = isLeaf(this,node);
  if (!bVar1) {
    __end0_1 = std::
               array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
               ::begin(&node->children);
    pvVar2 = std::
             array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
             ::end(&node->children);
    for (; __end0_1 != pvVar2; __end0_1 = __end0_1 + 1) {
      node_00 = std::
                unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                ::get(__end0_1);
      findIntersectionsInDescendants(this,node_00,value,intersections);
    }
  }
  return;
}

Assistant:

void findIntersectionsInDescendants(Node* node, const T& value, std::vector<std::pair<T, T>>& intersections) const
    {
        // Test against the values stored in this node
        for (const auto& other : node->values)
        {
            if (mGetBox(value).intersects(mGetBox(other)))
                intersections.emplace_back(value, other);
        }
        // Test against values stored into descendants of this node
        if (!isLeaf(node))
        {
            for (const auto& child : node->children)
                findIntersectionsInDescendants(child.get(), value, intersections);
        }
    }